

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDnsServiceRecord>::emplace<QDnsServiceRecord_const&>
          (QMovableArrayOps<QDnsServiceRecord> *this,qsizetype i,QDnsServiceRecord *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  Inserter *in_RDX;
  QDnsServiceRecord *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QDnsServiceRecord tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QArrayDataPointer<QDnsServiceRecord>::needsDetach
                    ((QArrayDataPointer<QDnsServiceRecord> *)in_RDI);
  if (!(bool)uVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar4 = QArrayDataPointer<QDnsServiceRecord>::freeSpaceAtEnd
                          ((QArrayDataPointer<QDnsServiceRecord> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar4 != 0)) {
      QArrayDataPointer<QDnsServiceRecord>::end((QArrayDataPointer<QDnsServiceRecord> *)in_RDI);
      QDnsServiceRecord::QDnsServiceRecord
                ((QDnsServiceRecord *)in_RDI,
                 (QDnsServiceRecord *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
      ;
      in_RDI->displaceTo = (QDnsServiceRecord *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_00354b1a;
    }
    if ((in_RSI == (QDnsServiceRecord *)0x0) &&
       (qVar4 = QArrayDataPointer<QDnsServiceRecord>::freeSpaceAtBegin
                          ((QArrayDataPointer<QDnsServiceRecord> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar4 != 0)) {
      QArrayDataPointer<QDnsServiceRecord>::begin((QArrayDataPointer<QDnsServiceRecord> *)0x3549f4);
      QDnsServiceRecord::QDnsServiceRecord
                ((QDnsServiceRecord *)in_RDI,
                 (QDnsServiceRecord *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
      ;
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QDnsServiceRecord *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_00354b1a;
    }
  }
  QDnsServiceRecord::QDnsServiceRecord
            ((QDnsServiceRecord *)in_RDI,
             (QDnsServiceRecord *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar5 = in_RDI->displaceTo != (QDnsServiceRecord *)0x0;
  uVar6 = bVar5 && in_RSI == (QDnsServiceRecord *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (QDnsServiceRecord *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QDnsServiceRecord>::detachAndGrow
            ((QArrayDataPointer<QDnsServiceRecord> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20)
             ,(qsizetype)in_RDX,
             (QDnsServiceRecord **)
             CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar3))),
             (QArrayDataPointer<QDnsServiceRecord> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QDnsServiceRecord> *)
                              CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar3
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QDnsServiceRecord *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QDnsServiceRecord>::begin((QArrayDataPointer<QDnsServiceRecord> *)0x354aae);
    QDnsServiceRecord::QDnsServiceRecord
              ((QDnsServiceRecord *)in_RDI,
               (QDnsServiceRecord *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QDnsServiceRecord *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  QDnsServiceRecord::~QDnsServiceRecord((QDnsServiceRecord *)0x354b1a);
LAB_00354b1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }